

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::deleteRboAttachedToNotBoundFboTest(TestContext *testCtx,Context *ctx)

{
  uint local_1c;
  Context *pCStack_18;
  deUint32 rbo;
  Context *ctx_local;
  TestContext *testCtx_local;
  
  pCStack_18 = ctx;
  ctx_local = (Context *)testCtx;
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  local_1c = 1;
  (*pCStack_18->_vptr_Context[0xc])(pCStack_18,0x8d41,1);
  (*pCStack_18->_vptr_Context[0x20])(pCStack_18,0x8d40,0x8d20,0x8d41,(ulong)local_1c);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8d20,0x8cd0,0x8d41);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8d20,0x8cd1,local_1c);
  (*pCStack_18->_vptr_Context[9])(pCStack_18,0x8d40,0);
  (*pCStack_18->_vptr_Context[0xe])(pCStack_18,1,&local_1c);
  (*pCStack_18->_vptr_Context[9])(pCStack_18,0x8d40,1);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8d20,0x8cd0,0x8d41);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8d20,0x8cd1,local_1c);
  return;
}

Assistant:

static void deleteRboAttachedToNotBoundFboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	deUint32 rbo = 1;
	ctx.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, rbo);

	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_RENDERBUFFER);
	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, rbo);

	ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

	ctx.deleteRenderbuffers(1, &rbo);

	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_RENDERBUFFER);
	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, rbo);
}